

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  code *cb;
  size_t local_68;
  size_t decrypted_length;
  undefined1 local_58 [4];
  int ret;
  st_ptls_record_t rec;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *decryptbuf_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  rec.fragment = (uint8_t *)properties;
  decrypted_length._4_4_ = parse_record(tls,(st_ptls_record_t *)local_58,(uint8_t *)input,inlen);
  if (decrypted_length._4_4_ != 0) {
    return decrypted_length._4_4_;
  }
  if (rec.length == 0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x120e,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_58[0] == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if ((rec._0_8_ != 1) || (*(char *)rec.length != '\x01')) {
      return 0x2f;
    }
    decrypted_length._4_4_ = 0x202;
    goto LAB_001175eb;
  }
  if (((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0) || (local_58[0] == '\x15'))
  {
    if ((local_58[0] != '\x17') ||
       (((tls->field_0x160 & 1) == 0 ||
        ((tls->field_18).server.early_data_skipped_bytes == 0xffffffff)))) goto LAB_001174fe;
  }
  else {
    if (local_58[0] != '\x17') {
      return 0x28;
    }
    decrypted_length._4_4_ = ptls_buffer_reserve(decryptbuf,rec._0_8_ + 5);
    if (decrypted_length._4_4_ != 0) {
      return decrypted_length._4_4_;
    }
    iVar1 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,&local_68
                         ,(void *)rec.length,rec._0_8_);
    if (iVar1 == 0) {
      rec.type = (undefined1)local_68;
      rec._1_1_ = local_68._1_1_;
      rec.version = local_68._2_2_;
      rec._4_4_ = local_68._4_4_;
      rec.length = (size_t)(decryptbuf->base + decryptbuf->off);
      for (; (rec._0_8_ != 0 && (*(uint8_t *)(rec.length + rec._0_8_ + -1) == '\0'));
          rec._0_8_ = rec._0_8_ + -1) {
      }
      if (rec._0_8_ == 0) {
        return 10;
      }
      local_58[0] = *(uint8_t *)(rec.length + rec._0_8_ + -1);
      rec._0_8_ = rec._0_8_ + -1;
LAB_001174fe:
      decrypted_length._4_4_ = 0;
      if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (local_58[0] != '\x16')) {
        if (local_58[0] == '\x15') {
          decrypted_length._4_4_ = handle_alert(tls,(uint8_t *)rec.length,rec._0_8_);
        }
        else if (local_58[0] == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
              if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
                decryptbuf->off = rec._0_8_ + decryptbuf->off;
              }
              decrypted_length._4_4_ = 0;
            }
            else {
              decrypted_length._4_4_ = 10;
            }
          }
          else {
            decryptbuf->off = rec._0_8_ + decryptbuf->off;
            decrypted_length._4_4_ = 0;
          }
        }
        else {
          decrypted_length._4_4_ = 10;
        }
      }
      else {
        cb = handle_client_handshake_message;
        if ((tls->field_0x160 & 1) != 0) {
          cb = handle_server_handshake_message;
        }
        decrypted_length._4_4_ =
             handle_handshake_record
                       (tls,cb,emitter,(st_ptls_record_t *)local_58,
                        (ptls_handshake_properties_t *)rec.fragment);
      }
      goto LAB_001175eb;
    }
    if ((tls->field_0x160 & 1) == 0) {
      return iVar1;
    }
    if ((tls->field_18).server.early_data_skipped_bytes == 0xffffffff) {
      return iVar1;
    }
  }
  (tls->field_18).server.early_data_skipped_bytes =
       rec._0_4_ + (tls->field_18).server.early_data_skipped_bytes;
  if (0x10000 < (tls->field_18).server.early_data_skipped_bytes) {
    return 0x28;
  }
  decrypted_length._4_4_ = 0x202;
LAB_001175eb:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  return decrypted_length._4_4_;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}